

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractFlowAnalysis.h
# Opt level: O3

void __thiscall
slang::analysis::AbstractFlowAnalysis<TestAnalysis,_int>::visitStmt
          (AbstractFlowAnalysis<TestAnalysis,_int> *this,ConditionalStatement *stmt)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  Expression *this_00;
  int iVar4;
  pointer pCVar5;
  Condition *cond;
  pointer pCVar6;
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_58;
  
  sVar3 = (stmt->conditions)._M_extent._M_extent_value;
  if (sVar3 == 0) {
    iVar4 = 0;
  }
  else {
    pCVar6 = (stmt->conditions)._M_ptr;
    pCVar5 = pCVar6 + sVar3;
    iVar4 = 0;
    do {
      this_00 = (pCVar6->expr).ptr;
      bVar1 = this->inCondition;
      this->inCondition = true;
      ast::Expression::visitExpression<slang::ast::Expression_const,TestAnalysis&>
                (this_00,this_00,(TestAnalysis *)this);
      this->inCondition = bVar1;
      adjustConditionalState((ConstantValue *)&local_58,this,this_00);
      std::__detail::__variant::
      _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      ::~_Variant_storage(&local_58);
      if (pCVar6->pattern != (Pattern *)0x0) {
        ast::Pattern::visit<TestAnalysis>(pCVar6->pattern,(TestAnalysis *)this);
      }
      iVar4 = iVar4 + this->stateWhenFalse;
      this->isStateSplit = false;
      this->state = this->stateWhenTrue;
      this->stateWhenTrue = 0;
      this->stateWhenFalse = 0;
      pCVar6 = pCVar6 + 1;
    } while (pCVar6 != pCVar5);
  }
  ast::Statement::visit<TestAnalysis&>(stmt->ifTrue,(TestAnalysis *)this);
  iVar2 = this->state;
  this->isStateSplit = false;
  this->state = iVar4;
  this->stateWhenTrue = 0;
  this->stateWhenFalse = 0;
  if (stmt->ifFalse != (Statement *)0x0) {
    ast::Statement::visit<TestAnalysis&>(stmt->ifFalse,(TestAnalysis *)this);
    iVar4 = this->state;
  }
  this->state = iVar4 + iVar2;
  return;
}

Assistant:

void visitStmt(const ConditionalStatement& stmt) {
        auto falseState = (DERIVED).unreachableState();
        for (auto& cond : stmt.conditions) {
            visitCondition(*cond.expr);

            if (cond.pattern)
                visit(*cond.pattern);

            (DERIVED).joinState(falseState, stateWhenFalse);
            setState(std::move(stateWhenTrue));
        }

        visit(stmt.ifTrue);

        auto trueState = std::move(state);
        setState(std::move(falseState));
        if (stmt.ifFalse)
            visit(*stmt.ifFalse);

        (DERIVED).joinState(state, trueState);
    }